

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::ContentEncoding::ParseEncryptionEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentEncryption *encryption)

{
  int iVar1;
  long lVar2;
  longlong lVar3;
  uchar *puVar4;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  longlong in_RDI;
  long *in_R8;
  long status_1;
  int read_status_2;
  uchar *buf_2;
  size_t buflen_2;
  int read_status_1;
  uchar *buf_1;
  size_t buflen_1;
  int read_status;
  uchar *buf;
  size_t buflen;
  long status;
  longlong size_1;
  longlong id;
  longlong stop;
  longlong pos;
  longlong *in_stack_ffffffffffffff28;
  longlong *in_stack_ffffffffffffff30;
  ContentEncAESSettings *in_stack_ffffffffffffff38;
  IMkvReader *in_stack_ffffffffffffff40;
  IMkvReader *in_stack_ffffffffffffff48;
  ContentEncoding *in_stack_ffffffffffffff58;
  long local_50;
  long local_48;
  long local_38;
  
  local_38 = in_RSI;
  do {
    if (in_RSI + in_RDX <= local_38) {
      return 0;
    }
    lVar2 = ParseElementHeader(in_stack_ffffffffffffff48,(longlong *)in_stack_ffffffffffffff40,
                               (longlong)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff28);
    if (lVar2 < 0) {
      return lVar2;
    }
    if (local_48 == 0x47e1) {
      lVar3 = UnserializeUInt(in_stack_ffffffffffffff48,(longlong)in_stack_ffffffffffffff40,
                              (longlong)in_stack_ffffffffffffff38);
      *in_R8 = lVar3;
      if (*in_R8 != 5) {
        return -2;
      }
    }
    else if (local_48 == 0x47e2) {
      in_stack_ffffffffffffff48 = (IMkvReader *)in_R8[1];
      if (in_stack_ffffffffffffff48 != (IMkvReader *)0x0) {
        operator_delete__(in_stack_ffffffffffffff48);
      }
      in_R8[1] = 0;
      in_R8[2] = 0;
      if (local_50 < 1) {
        return -2;
      }
      puVar4 = SafeArrayAlloc<unsigned_char>
                         ((unsigned_long_long)in_stack_ffffffffffffff38,
                          (unsigned_long_long)in_stack_ffffffffffffff30);
      if (puVar4 == (uchar *)0x0) {
        return -1;
      }
      iVar1 = (**(code **)*in_RCX)(in_RCX,local_38,local_50,puVar4);
      if (iVar1 != 0) {
        if (puVar4 == (uchar *)0x0) {
          return lVar2;
        }
        operator_delete__(puVar4);
        return lVar2;
      }
      in_R8[1] = (long)puVar4;
      in_R8[2] = local_50;
    }
    else if (local_48 == 0x47e3) {
      in_stack_ffffffffffffff38 = (ContentEncAESSettings *)in_R8[3];
      if (in_stack_ffffffffffffff38 != (ContentEncAESSettings *)0x0) {
        operator_delete__(in_stack_ffffffffffffff38);
      }
      in_R8[3] = 0;
      in_R8[4] = 0;
      if (local_50 < 1) {
        return -2;
      }
      puVar4 = SafeArrayAlloc<unsigned_char>
                         ((unsigned_long_long)in_stack_ffffffffffffff38,
                          (unsigned_long_long)in_stack_ffffffffffffff30);
      if (puVar4 == (uchar *)0x0) {
        return -1;
      }
      iVar1 = (**(code **)*in_RCX)(in_RCX,local_38,local_50,puVar4);
      if (iVar1 != 0) {
        if (puVar4 == (uchar *)0x0) {
          return lVar2;
        }
        operator_delete__(puVar4);
        return lVar2;
      }
      in_R8[3] = (long)puVar4;
      in_R8[4] = local_50;
    }
    else if (local_48 == 0x47e4) {
      in_stack_ffffffffffffff28 = (longlong *)in_R8[5];
      if (in_stack_ffffffffffffff28 != (longlong *)0x0) {
        operator_delete__(in_stack_ffffffffffffff28);
      }
      in_R8[5] = 0;
      in_R8[6] = 0;
      if (local_50 < 1) {
        return -2;
      }
      puVar4 = SafeArrayAlloc<unsigned_char>
                         ((unsigned_long_long)in_stack_ffffffffffffff38,
                          (unsigned_long_long)in_stack_ffffffffffffff30);
      if (puVar4 == (uchar *)0x0) {
        return -1;
      }
      iVar1 = (**(code **)*in_RCX)(in_RCX,local_38,local_50,puVar4);
      if (iVar1 != 0) {
        if (puVar4 == (uchar *)0x0) {
          return lVar2;
        }
        operator_delete__(puVar4);
        return lVar2;
      }
      in_R8[5] = (long)puVar4;
      in_R8[6] = local_50;
    }
    else if (local_48 == 0x47e5) {
      lVar3 = UnserializeUInt(in_stack_ffffffffffffff48,(longlong)in_stack_ffffffffffffff40,
                              (longlong)in_stack_ffffffffffffff38);
      in_R8[7] = lVar3;
    }
    else if (local_48 == 0x47e6) {
      lVar3 = UnserializeUInt(in_stack_ffffffffffffff48,(longlong)in_stack_ffffffffffffff40,
                              (longlong)in_stack_ffffffffffffff38);
      in_R8[8] = lVar3;
    }
    else if (local_48 == 0x47e7) {
      lVar2 = ParseContentEncAESSettingsEntry
                        (in_stack_ffffffffffffff58,in_RDI,(longlong)in_stack_ffffffffffffff48,
                         in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if (lVar2 != 0) {
        return lVar2;
      }
      in_stack_ffffffffffffff58 = (ContentEncoding *)0x0;
    }
    local_38 = local_50 + local_38;
    if (in_RSI + in_RDX < local_38) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseEncryptionEntry(long long start, long long size,
                                           IMkvReader* pReader,
                                           ContentEncryption* encryption) {
  assert(pReader);
  assert(encryption);

  long long pos = start;
  const long long stop = start + size;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncAlgo) {
      encryption->algo = UnserializeUInt(pReader, pos, size);
      if (encryption->algo != 5)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvContentEncKeyID) {
      delete[] encryption->key_id;
      encryption->key_id = NULL;
      encryption->key_id_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->key_id = buf;
      encryption->key_id_len = buflen;
    } else if (id == libwebm::kMkvContentSignature) {
      delete[] encryption->signature;
      encryption->signature = NULL;
      encryption->signature_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->signature = buf;
      encryption->signature_len = buflen;
    } else if (id == libwebm::kMkvContentSigKeyID) {
      delete[] encryption->sig_key_id;
      encryption->sig_key_id = NULL;
      encryption->sig_key_id_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->sig_key_id = buf;
      encryption->sig_key_id_len = buflen;
    } else if (id == libwebm::kMkvContentSigAlgo) {
      encryption->sig_algo = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentSigHashAlgo) {
      encryption->sig_hash_algo = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncAESSettings) {
      const long status = ParseContentEncAESSettingsEntry(
          pos, size, pReader, &encryption->aes_settings);
      if (status)
        return status;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;
}